

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_emit(yaml_emitter_t *emitter,yaml_event_t *event)

{
  yaml_event_t *pyVar1;
  int iVar2;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  if (((emitter->events).tail == (emitter->events).end) &&
     (iVar2 = yaml_queue_extend(&(emitter->events).start,&(emitter->events).head,
                                &(emitter->events).tail,&(emitter->events).end), iVar2 == 0)) {
    emitter->error = YAML_MEMORY_ERROR;
    yaml_event_delete(event);
    emitter_local._4_4_ = 0;
  }
  else {
    pyVar1 = (emitter->events).tail;
    (emitter->events).tail = pyVar1 + 1;
    memcpy(pyVar1,event,0x68);
    while (iVar2 = yaml_emitter_need_more_events(emitter), iVar2 == 0) {
      iVar2 = yaml_emitter_analyze_event(emitter,(emitter->events).head);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = yaml_emitter_state_machine(emitter,(emitter->events).head);
      if (iVar2 == 0) {
        return 0;
      }
      pyVar1 = (emitter->events).head;
      (emitter->events).head = pyVar1 + 1;
      yaml_event_delete(pyVar1);
    }
    emitter_local._4_4_ = 1;
  }
  return emitter_local._4_4_;
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_emit(yaml_emitter_t *emitter, yaml_event_t *event)
{
    if (!ENQUEUE(emitter, emitter->events, *event)) {
        yaml_event_delete(event);
        return 0;
    }

    while (!yaml_emitter_need_more_events(emitter)) {
        if (!yaml_emitter_analyze_event(emitter, emitter->events.head))
            return 0;
        if (!yaml_emitter_state_machine(emitter, emitter->events.head))
            return 0;
        yaml_event_delete(&DEQUEUE(emitter, emitter->events));
    }

    return 1;
}